

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptString.cpp
# Opt level: O3

BOOL __thiscall Js::JavascriptString::GetItemAt(JavascriptString *this,charcount_t index,Var *value)

{
  bool bVar1;
  char16 c;
  uint uVar2;
  JavascriptString *pJVar3;
  
  uVar2 = 0;
  if (index < 0x7fffffff) {
    bVar1 = index < this->m_charLength;
    if (bVar1) {
      c = GetItem(this,index);
      pJVar3 = CharStringCache::GetStringForChar
                         (&((((this->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
                           charStringCache,c);
      *value = pJVar3;
    }
    uVar2 = (uint)bVar1;
  }
  return uVar2;
}

Assistant:

BOOL JavascriptString::GetItemAt(charcount_t index, Var* value)
    {
        if (!IsValidIndexValue(index))
        {
            return false;
        }

        char16 character = GetItem(index);

        *value = this->GetLibrary()->GetCharStringCache().GetStringForChar(character);

        return true;
    }